

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planetephem.cpp
# Opt level: O2

CEExecOptions * DefineOpts(void)

{
  CEExecOptions *in_RDI;
  double default_val;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_d0,"planetephem",(allocator *)&local_b0);
  CEExecOptions::CEExecOptions(in_RDI,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  std::operator+(&local_90,&local_50,
                 "Returns the apparent ICRS RA,Dec and observed Az,Alt coordinates for ");
  std::operator+(&local_70,&local_90,
                 "a given planet for a given observer. It is important also to note ");
  std::operator+(&local_b0,&local_70,
                 "observed coordinates will be dubious very close to the horizon due ");
  std::operator+(&local_d0,&local_b0,"to the atmospheric correction algorithms employed.");
  std::__cxx11::string::_M_assign((string *)&(in_RDI->super_CLOptions).program_desc_);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string((string *)&local_d0,"p,planet",(allocator *)&local_70);
  std::__cxx11::string::string
            ((string *)&local_b0,
             "Planet number (1=Mercury, 2=Venus, 4=Mars, 5=Jupiter, 6=Saturn, 7=Uranus, 8=Neptune)",
             (allocator *)&local_90);
  CLOptions::AddIntParam(&in_RDI->super_CLOptions,&local_d0,&local_b0,0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  CEExecOptions::AddObserverPars(in_RDI);
  std::__cxx11::string::string((string *)&local_d0,"startJD",(allocator *)&local_70);
  std::__cxx11::string::string
            ((string *)&local_b0,
             "Starting time as a Julian date. Default will be the current Julian date",
             (allocator *)&local_90);
  default_val = (double)CEDate::CurrentJD();
  CLOptions::AddDoubleParam(&in_RDI->super_CLOptions,&local_d0,&local_b0,default_val);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::string((string *)&local_d0,"duration",(allocator *)&local_70);
  std::__cxx11::string::string
            ((string *)&local_b0,
             "Duration for printing out results (in minutes). Results will be printed from \'startJD\' to \'startJD + duration\'. Default is for one 24 hour period"
             ,(allocator *)&local_90);
  CLOptions::AddDoubleParam(&in_RDI->super_CLOptions,&local_d0,&local_b0,1440.0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::string((string *)&local_d0,"step",(allocator *)&local_70);
  std::__cxx11::string::string
            ((string *)&local_b0,"Number of minutes between each line of the print out.",
             (allocator *)&local_90);
  CLOptions::AddDoubleParam(&in_RDI->super_CLOptions,&local_d0,&local_b0,30.0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::string((string *)&local_d0,"method",(allocator *)&local_70);
  std::__cxx11::string::string
            ((string *)&local_b0,
             "Method for computing planet positions (\'sofa\' or \'jpl\', default=\'sofa\')",
             (allocator *)&local_90);
  std::__cxx11::string::string((string *)&local_30,"sofa",(allocator *)&local_50);
  CLOptions::AddStringParam(&in_RDI->super_CLOptions,&local_d0,&local_b0,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  CEExecOptions::AddCorrFilePars(in_RDI);
  return in_RDI;
}

Assistant:

CEExecOptions DefineOpts()
{
    CEExecOptions opts("planetephem");

    // Add version and description
    opts.AddProgramDescription(std::string() +
        "Returns the apparent ICRS RA,Dec and observed Az,Alt coordinates for " +
        "a given planet for a given observer. It is important also to note " +
        "observed coordinates will be dubious very close to the horizon due " +
        "to the atmospheric correction algorithms employed.");

    // Define the parameters
    opts.AddIntParam("p,planet",
                     "Planet number (1=Mercury, 2=Venus, 4=Mars, 5=Jupiter, 6=Saturn, 7=Uranus, 8=Neptune)",
                     0);

    // Observer parameters
    opts.AddObserverPars();

    // Time information
    opts.AddDoubleParam("startJD",
                        "Starting time as a Julian date. Default will be the current Julian date",
                        CEDate::CurrentJD());
    opts.AddDoubleParam("duration",
                        "Duration for printing out results (in minutes). Results will be printed from 'startJD' to 'startJD + duration'. Default is for one 24 hour period",
                        24.0*60.0);
    opts.AddDoubleParam("step",
                        "Number of minutes between each line of the print out.",
                        30.0);
    opts.AddStringParam("method",
                        "Method for computing planet positions ('sofa' or 'jpl', default='sofa')",
                        "sofa");

    opts.AddCorrFilePars();
    return opts ;
}